

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O0

bool __thiscall
deqp::egl::SurfaceConfig::compareTo
          (SurfaceConfig *this,SurfaceConfig *b,BVec4 *specifiedRGBColors,
          BVec2 *specifiedLuminanceColors,bool yuvPlaneBppSpecified)

{
  bool bVar1;
  TestError *this_00;
  int local_38;
  int ndx;
  bool yuvPlaneBppSpecified_local;
  BVec2 *specifiedLuminanceColors_local;
  BVec4 *specifiedRGBColors_local;
  SurfaceConfig *b_local;
  SurfaceConfig *this_local;
  
  bVar1 = egl::operator==(this,b);
  if (bVar1) {
    return false;
  }
  local_38 = 0;
  do {
    if (0xb < local_38) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unable to compare configs - duplicate ID?",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                 ,0x119);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (compareTo::compareFuncs[local_38] == (CompareFunc)0x0) {
      bVar1 = compareColorBufferBits
                        (this,b,specifiedRGBColors,specifiedLuminanceColors,yuvPlaneBppSpecified);
      if (bVar1) {
        return true;
      }
      bVar1 = compareColorBufferBits
                        (b,this,specifiedRGBColors,specifiedLuminanceColors,yuvPlaneBppSpecified);
      if (bVar1) {
        return false;
      }
    }
    else {
      bVar1 = (*compareTo::compareFuncs[local_38])(this,b);
      if (bVar1) {
        return true;
      }
      bVar1 = (*compareTo::compareFuncs[local_38])(b,this);
      if (bVar1) {
        return false;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

bool compareTo (const SurfaceConfig& b, const tcu::BVec4& specifiedRGBColors, const tcu::BVec2& specifiedLuminanceColors, bool yuvPlaneBppSpecified) const
	{
		static const SurfaceConfig::CompareFunc compareFuncs[] =
		{
			SurfaceConfig::compareCaveat,
			SurfaceConfig::compareColorBufferType,
			SurfaceConfig::compareColorComponentType,
			DE_NULL, // SurfaceConfig::compareColorBufferBits,
			SurfaceConfig::compareAttributeSmaller<EGL_BUFFER_SIZE>,
			SurfaceConfig::compareAttributeSmaller<EGL_SAMPLE_BUFFERS>,
			SurfaceConfig::compareAttributeSmaller<EGL_SAMPLES>,
			SurfaceConfig::compareAttributeSmaller<EGL_DEPTH_SIZE>,
			SurfaceConfig::compareAttributeSmaller<EGL_STENCIL_SIZE>,
			SurfaceConfig::compareAttributeSmaller<EGL_ALPHA_MASK_SIZE>,
			SurfaceConfig::compareYuvOrder,
			SurfaceConfig::compareAttributeSmaller<EGL_CONFIG_ID>
		};

		if (*this == b)
			return false; // std::sort() can compare object to itself.

		for (int ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(compareFuncs); ndx++)
		{
			if (!compareFuncs[ndx])
			{
				if (compareColorBufferBits(*this, b, specifiedRGBColors, specifiedLuminanceColors, yuvPlaneBppSpecified))
					return true;
				else if (compareColorBufferBits(b, *this, specifiedRGBColors, specifiedLuminanceColors, yuvPlaneBppSpecified))
					return false;

				continue;
			}

			if (compareFuncs[ndx](*this, b))
				return true;
			else if (compareFuncs[ndx](b, *this))
				return false;
		}

		TCU_FAIL("Unable to compare configs - duplicate ID?");
	}